

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

string * __thiscall httplib::Request::get_header_value(Request *this,string *key,size_t id)

{
  allocator<char> *in_RCX;
  char *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  char *in_stack_ffffffffffffffc0;
  size_t in_stack_ffffffffffffffc8;
  string *in_stack_ffffffffffffffd0;
  Headers *in_stack_ffffffffffffffd8;
  
  detail::get_header_value
            (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
             in_stack_ffffffffffffffc0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(in_RSI,in_RDX,in_RCX);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffdf);
  return in_RDI;
}

Assistant:

inline std::string Request::get_header_value(const std::string &key,
                                             size_t id) const {
  return detail::get_header_value(headers, key, id, "");
}